

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O2

void tf::detail::
     parallel_pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
               (Runtime *rt,int *begin,long end,int param_4,byte param_5)

{
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar10;
  int local_a0;
  anon_class_64_6_4db4d30f local_78;
  
  local_a0 = param_4;
  while( true ) {
    uVar6 = end - (long)begin >> 2;
    if (uVar6 < 0x18) {
      if ((param_5 & 1) == 0) {
        unguarded_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin,end);
      }
      else {
        insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin,end);
      }
      return;
    }
    if (uVar6 < 0x1001) break;
    uVar8 = uVar6 * 2 & 0xfffffffffffffffc;
    sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (begin,uVar8 + (long)begin,end + -4);
    lVar7 = (long)begin + (uVar8 - 4);
    sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (begin + 1,lVar7,end + -8);
    piVar9 = (int *)(uVar8 + (long)begin);
    sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (begin + 2,piVar9 + 1,end + -0xc);
    sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (lVar7,uVar8 + (long)begin,piVar9 + 1);
    iVar1 = *begin;
    *begin = *piVar9;
    *piVar9 = iVar1;
    if (((param_5 & 1) == 0) && (*begin <= begin[-1])) {
      _Var4 = partition_left<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                        (begin,end);
      begin = _Var4._M_current + 1;
    }
    else {
      pVar10 = partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                         (begin,end);
      _Var4 = pVar10.first._M_current;
      uVar5 = (long)_Var4._M_current - (long)begin >> 2;
      piVar9 = _Var4._M_current + 1;
      uVar8 = end - (long)piVar9 >> 2;
      if ((uVar5 < uVar6 >> 3) || (uVar8 < uVar6 >> 3)) {
        local_a0 = local_a0 + -1;
        if (local_a0 == 0) {
          std::
          make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                    (begin,end);
          std::
          sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                    (begin,end);
          return;
        }
        if (0x17 < uVar5) {
          uVar6 = uVar5 & 0xfffffffffffffffc;
          iVar1 = *begin;
          *begin = *(int *)((long)begin + uVar6);
          *(int *)((long)begin + uVar6) = iVar1;
          iVar1 = _Var4._M_current[-1];
          _Var4._M_current[-1] = *(_Var4._M_current - uVar6);
          *(_Var4._M_current - uVar6) = iVar1;
          if (0x80 < uVar5) {
            uVar5 = uVar5 >> 2;
            iVar1 = begin[1];
            begin[1] = begin[uVar5 + 1];
            begin[uVar5 + 1] = iVar1;
            iVar1 = begin[2];
            begin[2] = begin[uVar5 + 2];
            begin[uVar5 + 2] = iVar1;
            iVar1 = _Var4._M_current[-2];
            _Var4._M_current[-2] = _Var4._M_current[~uVar5];
            _Var4._M_current[~uVar5] = iVar1;
            iVar1 = _Var4._M_current[-3];
            _Var4._M_current[-3] = _Var4._M_current[-2 - uVar5];
            _Var4._M_current[-2 - uVar5] = iVar1;
          }
        }
        if (0x17 < uVar8) {
          uVar6 = uVar8 & 0xfffffffffffffffc;
          iVar1 = _Var4._M_current[1];
          _Var4._M_current[1] = *(_Var4._M_current + uVar6 + 4);
          *(_Var4._M_current + uVar6 + 4) = iVar1;
          uVar2 = *(undefined4 *)(end + -4);
          *(undefined4 *)(end + -4) = *(undefined4 *)(end - uVar6);
          *(undefined4 *)(end - uVar6) = uVar2;
          if (0x80 < uVar8) {
            uVar8 = uVar8 >> 2;
            iVar1 = _Var4._M_current[2];
            _Var4._M_current[2] = _Var4._M_current[uVar8 + 2];
            _Var4._M_current[uVar8 + 2] = iVar1;
            iVar1 = _Var4._M_current[3];
            _Var4._M_current[3] = _Var4._M_current[uVar8 + 3];
            _Var4._M_current[uVar8 + 3] = iVar1;
            uVar2 = *(undefined4 *)(end + -8);
            *(undefined4 *)(end + -8) = *(undefined4 *)(end + ~uVar8 * 4);
            *(undefined4 *)(end + ~uVar8 * 4) = uVar2;
            uVar2 = *(undefined4 *)(end + -0xc);
            *(undefined4 *)(end + -0xc) = *(undefined4 *)(end + (-2 - uVar8) * 4);
            *(undefined4 *)(end + (-2 - uVar8) * 4) = uVar2;
          }
        }
      }
      else if (((((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
               (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                                  (begin,_Var4._M_current), bVar3)) &&
              (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                                 (piVar9,end), bVar3)) {
        return;
      }
      local_78.rt._executor = rt->_executor;
      local_78.rt._17_8_ = *(undefined8 *)((long)&rt->_parent + 1);
      local_78.rt._parent._0_1_ =
           (undefined1)((ulong)*(undefined8 *)((long)&rt->_worker + 1) >> 0x38);
      local_78.rt._worker._0_1_ = SUB81(rt->_worker,0);
      local_78.rt._worker._1_7_ = (undefined7)((ulong)rt->_worker >> 8);
      local_78.begin._M_current = begin;
      local_78.pivot_pos._M_current = _Var4._M_current;
      local_78.bad_allowed = local_a0;
      local_78.leftmost = (bool)param_5;
      Runtime::
      silent_async<tf::detail::parallel_pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>(tf::Runtime&,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,int,bool)::_lambda()_1_>
                (rt,&local_78);
      param_5 = 0;
      begin = piVar9;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
            (begin,end);
  return;
}

Assistant:

void parallel_pdqsort(
  Runtime& rt,
  Iter begin, Iter end, Compare comp,
  int bad_allowed, bool leftmost = true
) {

  // Partitions below this size are sorted sequentially
  constexpr auto cutoff = parallel_sort_cutoff<Iter>();

  // Partitions below this size are sorted using insertion sort
  constexpr auto insertion_sort_threshold = 24;

  // Partitions above this size use Tukey's ninther to select the pivot.
  constexpr auto ninther_threshold = 128;

  //using diff_t = typename std::iterator_traits<Iter>::difference_type;

  // Use a while loop for tail recursion elimination.
  while (true) {

    //diff_t size = end - begin;
    size_t size = end - begin;

    // Insertion sort is faster for small arrays.
    if (size < insertion_sort_threshold) {
      if (leftmost) {
        insertion_sort(begin, end, comp);
      }
      else {
        unguarded_insertion_sort(begin, end, comp);
      }
      return;
    }

    if(size <= cutoff) {
      std::sort(begin, end, comp);
      return;
    }

    // Choose pivot as median of 3 or pseudomedian of 9.
    //diff_t s2 = size / 2;
    size_t s2 = size >> 1;
    if (size > ninther_threshold) {
      sort3(begin, begin + s2, end - 1, comp);
      sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
      sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
      sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
      std::iter_swap(begin, begin + s2);
    }
    else {
      sort3(begin + s2, begin, end - 1, comp);
    }

    // If *(begin - 1) is the end of the right partition
    // of a previous partition operation, there is no element in [begin, end)
    // that is smaller than *(begin - 1).
    // Then if our pivot compares equal to *(begin - 1) we change strategy,
    // putting equal elements in the left partition,
    // greater elements in the right partition.
    // We do not have to recurse on the left partition,
    // since it's sorted (all equal).
    if (!leftmost && !comp(*(begin - 1), *begin)) {
      begin = partition_left(begin, end, comp) + 1;
      continue;
    }

    // Partition and get results.
    const auto pair = Branchless ? partition_right_branchless(begin, end, comp) :
                                   partition_right(begin, end, comp);
       
    const auto pivot_pos = pair.first;
    const auto already_partitioned = pair.second;

    // Check for a highly unbalanced partition.
    //diff_t l_size = pivot_pos - begin;
    //diff_t r_size = end - (pivot_pos + 1);
    const size_t l_size = pivot_pos - begin;
    const size_t r_size = end - (pivot_pos + 1);
    const bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

    // If we got a highly unbalanced partition we shuffle elements
    // to break many patterns.
    if (highly_unbalanced) {
      // If we had too many bad partitions, switch to heapsort
      // to guarantee O(n log n).
      if (--bad_allowed == 0) {
        std::make_heap(begin, end, comp);
        std::sort_heap(begin, end, comp);
        return;
      }

      if (l_size >= insertion_sort_threshold) {
        std::iter_swap(begin, begin + l_size / 4);
        std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);
        if (l_size > ninther_threshold) {
          std::iter_swap(begin + 1, begin + (l_size / 4 + 1));
          std::iter_swap(begin + 2, begin + (l_size / 4 + 2));
          std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
          std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
        }
      }

      if (r_size >= insertion_sort_threshold) {
        std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
        std::iter_swap(end - 1,                   end - r_size / 4);
        if (r_size > ninther_threshold) {
          std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
          std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
          std::iter_swap(end - 2,             end - (1 + r_size / 4));
          std::iter_swap(end - 3,             end - (2 + r_size / 4));
        }
      }
    }
    // decently balanced
    else {
      // sequence try to use insertion sort.
      if (already_partitioned &&
          partial_insertion_sort(begin, pivot_pos, comp) &&
          partial_insertion_sort(pivot_pos + 1, end, comp)
      ) {
        return;
      }
    }

    // Sort the left partition first using recursion and
    // do tail recursion elimination for the right-hand partition.
    // here we need to copy runtime so it stays alive during the sort recursion
    rt.silent_async([=] () mutable {
      parallel_pdqsort<Iter, Compare, Branchless>(
        rt, begin, pivot_pos, comp, bad_allowed, leftmost
      );
    });
    begin = pivot_pos + 1;
    leftmost = false;
  }
}